

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall LinearNE<2,_3,_1>::wakeup(LinearNE<2,_3,_1> *this,int i,int param_2)

{
  IntView<2> *pIVar1;
  long lVar2;
  int iVar3;
  TrailElem local_48;
  int64_t local_38;
  
  if (i < this->sz) {
    local_48.pt = &(this->num_unfixed).v;
    local_48.x = (this->num_unfixed).v;
    iVar3 = local_48.x + -1;
    local_48.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_48);
    (this->num_unfixed).v = iVar3;
    local_38 = (this->sum_fixed).v;
    if (i < *(int *)&(this->super_Propagator).field_0x14) {
      pIVar1 = this->x;
      lVar2 = (long)((pIVar1[i].var)->min).v;
    }
    else {
      pIVar1 = (IntView<2> *)this->y;
      lVar2 = -(long)((pIVar1[i].var)->min).v;
    }
    iVar3 = pIVar1[i].a;
    local_48.x = (int)(this->sum_fixed).v;
    local_48.sz = 4;
    local_48.pt = (int *)&this->sum_fixed;
    vec<TrailElem>::push(&engine.trail,&local_48);
    local_48.pt = (int *)((long)&(this->sum_fixed).v + 4);
    local_48.x = *(int *)((long)&(this->sum_fixed).v + 4);
    local_48.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_48);
    (this->sum_fixed).v = iVar3 * lVar2 + local_38;
  }
  iVar3 = (this->num_unfixed).v;
  if ((iVar3 < 2) &&
     ((((uint)(this->r).s * -2 + 1 == (int)sat.assigns.data[(uint)(this->r).v] ||
       ((iVar3 == 0 && (sat.assigns.data[(uint)(this->r).v] == '\0')))) &&
      ((this->super_Propagator).in_queue == false)))) {
    (this->super_Propagator).in_queue = true;
    local_48.pt = (int *)this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,
               (Propagator **)&local_48);
  }
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}